

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Any.hpp
# Opt level: O2

void __thiscall
rc::detail::Any::
AnyImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~AnyImpl
          (AnyImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this)

{
  ~AnyImpl(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

AnyImpl(ValueT &&value)
      : m_value(std::forward<ValueT>(value)) {}